

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O1

int fftm2s(int year,int month,int day,int hour,int minute,double second,int decimals,char *datestr,
          int *status)

{
  int iVar1;
  ulong uVar2;
  char *__format;
  ulong uVar3;
  char errmsg [81];
  
  if (0 < *status) {
    return *status;
  }
  uVar2 = (ulong)(uint)decimals;
  *datestr = '\0';
  if (((month != 0 || year != 0) || day != 0) &&
     (iVar1 = ffverifydate(year,month,day,status), 0 < iVar1)) {
    ffpmsg("invalid date (fftm2s)");
LAB_001b9e6e:
    return *status;
  }
  if ((uint)hour < 0x18) {
    if ((uint)minute < 0x3c) {
      if ((second < 0.0) || (61.0 <= second)) {
        snprintf(errmsg,0x51,"input second value is out of range 0 - 60.999: %f (fftm2s)");
        goto LAB_001b9eb6;
      }
      if (decimals < 0x1a) {
        uVar3 = 2;
        if (decimals != 0) {
          uVar3 = (ulong)(decimals + 3);
        }
        if (decimals < 0) {
          sprintf(datestr,"%.4d-%.2d-%.2d",(ulong)(uint)year,month,(ulong)(uint)day);
        }
        else if ((month == 0 && year == 0) && day == 0) {
          sprintf(datestr,"%.2d:%.2d:%0*.*f",(ulong)(uint)hour,(ulong)(uint)minute,uVar3,uVar2);
        }
        else {
          sprintf(datestr,"%.4d-%.2d-%.2dT%.2d:%.2d:%0*.*f",(ulong)(uint)year,month,(ulong)(uint)day
                  ,(ulong)(uint)hour,(ulong)(uint)minute,uVar3,uVar2);
        }
        goto LAB_001b9e6e;
      }
      __format = "input decimals value is out of range 0 - 25: %d (fftm2s)";
    }
    else {
      __format = "input minute value is out of range 0 - 59: %d (fftm2s)";
      uVar2 = (ulong)(uint)minute;
    }
  }
  else {
    __format = "input hour value is out of range 0 - 23: %d (fftm2s)";
    uVar2 = (ulong)(uint)hour;
  }
  snprintf(errmsg,0x51,__format,uVar2);
LAB_001b9eb6:
  ffpmsg(errmsg);
  *status = 0x1a4;
  return 0x1a4;
}

Assistant:

int fftm2s(int year,          /* I - year (0 - 9999)           */
           int month,         /* I - month (1 - 12)            */
           int day,           /* I - day (1 - 31)              */
           int hour,          /* I - hour (0 - 23)             */
           int minute,        /* I - minute (0 - 59)           */
           double second,     /* I - second (0. - 60.9999999)  */
           int decimals,      /* I - number of decimal points to write      */
           char *datestr,     /* O - date string: "YYYY-MM-DDThh:mm:ss.ddd" */
                              /*   or "hh:mm:ss.ddd" if year, month day = 0 */
           int   *status)     /* IO - error status             */
/*
  Construct a date and time character string
*/
{
    int width;
    char errmsg[FLEN_ERRMSG];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    *datestr='\0';

    if (year != 0 || month != 0 || day !=0)
    { 
        if (ffverifydate(year, month, day, status) > 0)
	{
            ffpmsg("invalid date (fftm2s)");
            return(*status);
        }
    }

    if (hour < 0 || hour > 23)
    {
       snprintf(errmsg, FLEN_ERRMSG,
       "input hour value is out of range 0 - 23: %d (fftm2s)", hour);
       ffpmsg(errmsg);
       return(*status = BAD_DATE);
    }
    else if (minute < 0 || minute > 59)
    {
       snprintf(errmsg, FLEN_ERRMSG,
       "input minute value is out of range 0 - 59: %d (fftm2s)", minute);
       ffpmsg(errmsg);
       return(*status = BAD_DATE);
    }
    else if (second < 0. || second >= 61)
    {
       snprintf(errmsg, FLEN_ERRMSG,
       "input second value is out of range 0 - 60.999: %f (fftm2s)", second);
       ffpmsg(errmsg);
       return(*status = BAD_DATE);
    }
    else if (decimals > 25)
    {
       snprintf(errmsg, FLEN_ERRMSG,
       "input decimals value is out of range 0 - 25: %d (fftm2s)", decimals);
       ffpmsg(errmsg);
       return(*status = BAD_DATE);
    }

    if (decimals == 0)
       width = 2;
    else
       width = decimals + 3;

    if (decimals < 0)
    {
        /* a negative decimals value means return only the date, not time */
        sprintf(datestr, "%.4d-%.2d-%.2d", year, month, day);
    }
    else if (year == 0 && month == 0 && day == 0)
    {
        /* return only the time, not the date */
        sprintf(datestr, "%.2d:%.2d:%0*.*f",
            hour, minute, width, decimals, second);
    }
    else
    {
        /* return both the time and date */
        sprintf(datestr, "%.4d-%.2d-%.2dT%.2d:%.2d:%0*.*f",
            year, month, day, hour, minute, width, decimals, second);
    }
    return(*status);
}